

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O2

invocation_table<afsm::test::events::comma> *
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>>
::state_table<afsm::test::events::comma,0ul>(indexes_tuple<0UL> *param_1)

{
  int iVar1;
  
  if ((state_table<afsm::test::events::comma,0ul>(psst::meta::indexes_tuple<0ul>const&)::_table ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&state_table<afsm::test::events::comma,0ul>(psst::meta::indexes_tuple<0ul>const&)
                                   ::_table), iVar1 != 0)) {
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_>
    ::state_table<afsm::test::events::comma,_0UL>::_table._M_elems[0].super__Function_base.
    _M_functor = (_Any_data)ZEXT816(0);
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_>
    ::state_table<afsm::test::events::comma,_0UL>::_table._M_elems[0]._M_invoker =
         std::
         _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_afsm::test::events::comma_&&),_afsm::actions::detail::process_event_handler<0UL>_>
         ::_M_invoke;
    inner_dispatch_table<std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_>
    ::state_table<afsm::test::events::comma,_0UL>::_table._M_elems[0].super__Function_base.
    _M_manager = std::
                 _Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_afsm::test::events::comma_&&),_afsm::actions::detail::process_event_handler<0UL>_>
                 ::_M_manager;
    __cxa_atexit(std::
                 array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_afsm::test::events::comma_&&)>,_1UL>
                 ::~array,&inner_dispatch_table<std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_>
                           ::state_table<afsm::test::events::comma,_0UL>::_table,&__dso_handle);
    __cxa_guard_release(&state_table<afsm::test::events::comma,0ul>(psst::meta::indexes_tuple<0ul>const&)
                         ::_table);
  }
  return &inner_dispatch_table<std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_>
          ::state_table<afsm::test::events::comma,_0UL>::_table;
}

Assistant:

static invocation_table<Event> const&
    state_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        static invocation_table<Event> _table {{ process_event_handler<Indexes>{}... }};
        return _table;
    }